

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O3

string * Disassembler::iType(string *__return_storage_ptr__,string *bin,int line)

{
  undefined4 uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong **ppuVar7;
  long lVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  ulong *puVar12;
  size_type *psVar13;
  pointer ppVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong **ppuVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string op;
  string imm;
  string rt;
  string rs;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong **local_210;
  undefined8 local_208;
  ulong *local_200;
  undefined8 uStack_1f8;
  ulong **local_1f0;
  long local_1e8;
  ulong *local_1e0;
  undefined8 uStack_1d8;
  ulong **local_1d0;
  long local_1c8;
  ulong *local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong **local_190 [2];
  ulong *local_180 [2];
  string local_170;
  ulong *local_150 [2];
  ulong local_140 [2];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)bin);
  AsmFuncts::getOpCode(&local_170,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)bin);
  AsmFuncts::getRegCode(&local_110,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_90,(ulong)bin);
  AsmFuncts::getRegCode(&local_130,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)bin);
  uVar3 = Conversion::binToDec(&local_b0);
  uVar16 = -uVar3;
  if (0 < (int)uVar3) {
    uVar16 = uVar3;
  }
  uVar18 = 1;
  if (9 < uVar16) {
    uVar15 = (ulong)uVar16;
    uVar11 = 4;
    do {
      uVar18 = uVar11;
      uVar10 = (uint)uVar15;
      if (uVar10 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_001264c6;
      }
      if (uVar10 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_001264c6;
      }
      if (uVar10 < 10000) goto LAB_001264c6;
      uVar15 = uVar15 / 10000;
      uVar11 = uVar18 + 4;
    } while (99999 < uVar10);
    uVar18 = uVar18 + 1;
  }
LAB_001264c6:
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct((ulong)local_150,(char)uVar18 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_150[0]),uVar18,uVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_170);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_170), iVar4 == 0)) {
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_190,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    std::__cxx11::string::append((char *)local_190);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_190,(ulong)local_130._M_dataplus._M_p);
    ppuVar7 = (ulong **)(plVar5 + 2);
    if ((ulong **)*plVar5 == ppuVar7) {
      local_1c0 = *ppuVar7;
      lStack_1b8 = plVar5[3];
      local_1d0 = &local_1c0;
    }
    else {
      local_1c0 = *ppuVar7;
      local_1d0 = (ulong **)*plVar5;
    }
    local_1c8 = plVar5[1];
    *plVar5 = (long)ppuVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
    puVar12 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar12) {
      local_1a0 = *puVar12;
      lStack_198 = puVar6[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *puVar12;
      local_1b0 = (ulong *)*puVar6;
    }
    local_1a8 = puVar6[1];
    *puVar6 = puVar12;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_150[0]);
    local_210 = &local_200;
    ppuVar7 = (ulong **)(puVar6 + 2);
    if ((ulong **)*puVar6 == ppuVar7) {
      local_200 = *ppuVar7;
      uStack_1f8 = puVar6[3];
    }
    else {
      local_200 = *ppuVar7;
      local_210 = (ulong **)*puVar6;
    }
    local_208 = puVar6[1];
    *puVar6 = ppuVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
    puVar12 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar12) {
      local_220 = *puVar12;
      lStack_218 = plVar5[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar12;
      local_230 = (ulong *)*plVar5;
    }
    local_228 = plVar5[1];
    *plVar5 = (long)puVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_110._M_dataplus._M_p);
    ppuVar7 = (ulong **)(puVar6 + 2);
    if ((ulong **)*puVar6 == ppuVar7) {
      local_1e0 = *ppuVar7;
      uStack_1d8 = puVar6[3];
      local_1f0 = &local_1e0;
    }
    else {
      local_1e0 = *ppuVar7;
      local_1f0 = (ulong **)*puVar6;
    }
    local_1e8 = puVar6[1];
    *puVar6 = ppuVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar13 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar13) {
      lVar8 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar13;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0);
    }
    ppuVar7 = local_190[0];
    if (local_190[0] == local_180) goto LAB_0012690a;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_170);
    if (iVar4 == 0) {
      ppuVar19 = &local_200;
      local_210 = ppuVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,local_170._M_dataplus._M_p,
                 local_170._M_dataplus._M_p + local_170._M_string_length);
      std::__cxx11::string::append((char *)&local_210);
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_130._M_dataplus._M_p)
      ;
      puVar12 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar12) {
        local_220 = *puVar12;
        lStack_218 = puVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar12;
        local_230 = (ulong *)*puVar6;
      }
      local_228 = puVar6[1];
      *puVar6 = puVar12;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
      ppuVar7 = (ulong **)(puVar6 + 2);
      if ((ulong **)*puVar6 == ppuVar7) {
        local_1e0 = *ppuVar7;
        uStack_1d8 = puVar6[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *ppuVar7;
        local_1f0 = (ulong **)*puVar6;
      }
      local_1e8 = puVar6[1];
      *puVar6 = ppuVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_150[0]);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar13 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar13) {
        lVar8 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar8;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar13;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0);
      }
      ppuVar7 = local_210;
      if (local_230 != &local_220) {
        operator_delete(local_230);
        ppuVar7 = local_210;
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_170);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_170), iVar4 == 0)) {
        uVar16 = -labelCount;
        if (0 < labelCount) {
          uVar16 = labelCount;
        }
        uVar3 = 1;
        if (9 < uVar16) {
          uVar15 = (ulong)uVar16;
          uVar18 = 4;
          do {
            uVar3 = uVar18;
            uVar11 = (uint)uVar15;
            if (uVar11 < 100) {
              uVar3 = uVar3 - 2;
              goto LAB_00126d3b;
            }
            if (uVar11 < 1000) {
              uVar3 = uVar3 - 1;
              goto LAB_00126d3b;
            }
            if (uVar11 < 10000) goto LAB_00126d3b;
            uVar15 = uVar15 / 10000;
            uVar18 = uVar3 + 4;
          } while (99999 < uVar11);
          uVar3 = uVar3 + 1;
        }
LAB_00126d3b:
        uVar18 = (uint)labelCount >> 0x1f;
        local_230 = &local_220;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_230,(char)uVar3 - (char)(labelCount >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)uVar18 + (long)local_230),uVar3,uVar16);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0x12b0f9);
        local_1f0 = &local_1e0;
        ppuVar7 = (ulong **)(puVar6 + 2);
        if ((ulong **)*puVar6 == ppuVar7) {
          local_1e0 = *ppuVar7;
          uStack_1d8 = puVar6[3];
        }
        else {
          local_1e0 = *ppuVar7;
          local_1f0 = (ulong **)*puVar6;
        }
        local_1e8 = puVar6[1];
        *puVar6 = ppuVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        puVar12 = local_150[0];
        ppuVar7 = (ulong **)__errno_location();
        uVar1 = *(undefined4 *)ppuVar7;
        *(undefined4 *)ppuVar7 = 0;
        lVar8 = strtol((char *)puVar12,(char **)&local_230,10);
        if (local_230 == puVar12) {
          std::__throw_invalid_argument("stoi");
LAB_00127423:
          uVar9 = std::__throw_out_of_range("stoi");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230);
          }
          if (local_210 != &local_230) {
            operator_delete(local_210);
          }
          if (local_1b0 != puVar12) {
            operator_delete(local_1b0);
          }
          if (local_1d0 != ppuVar7) {
            operator_delete(local_1d0);
          }
          if (local_190[0] != (ulong **)(ulong)(uint)line) {
            operator_delete(local_190[0]);
          }
          if (local_1f0 != &local_1e0) {
            operator_delete(local_1f0);
          }
          if (local_150[0] != local_140) {
            operator_delete(local_150[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          _Unwind_Resume(uVar9);
        }
        iVar4 = (int)lVar8;
        if ((iVar4 != lVar8) || (*(int *)ppuVar7 == 0x22)) goto LAB_00127423;
        if (*(int *)ppuVar7 == 0) {
          *(undefined4 *)ppuVar7 = uVar1;
        }
        uVar16 = iVar4 + line + 1;
        if ((long)labels_abi_cxx11_.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)labels_abi_cxx11_.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_00126f34:
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_1f0,local_1e8 + (long)local_1f0);
          addLabel(uVar16,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          local_190[0] = local_180;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_190,local_170._M_dataplus._M_p,
                     local_170._M_dataplus._M_p + local_170._M_string_length);
          std::__cxx11::string::append((char *)local_190);
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)local_190,(ulong)local_110._M_dataplus._M_p);
          local_1d0 = &local_1c0;
          ppuVar7 = (ulong **)(puVar6 + 2);
          if ((ulong **)*puVar6 == ppuVar7) {
            local_1c0 = *ppuVar7;
            lStack_1b8 = puVar6[3];
          }
          else {
            local_1c0 = *ppuVar7;
            local_1d0 = (ulong **)*puVar6;
          }
          local_1c8 = puVar6[1];
          *puVar6 = ppuVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
          local_1b0 = &local_1a0;
          puVar12 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar12) {
            local_1a0 = *puVar12;
            lStack_198 = puVar6[3];
          }
          else {
            local_1a0 = *puVar12;
            local_1b0 = (ulong *)*puVar6;
          }
          local_1a8 = puVar6[1];
          *puVar6 = puVar12;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)local_130._M_dataplus._M_p);
          local_210 = &local_200;
          ppuVar7 = (ulong **)(puVar6 + 2);
          if ((ulong **)*puVar6 == ppuVar7) {
            local_200 = *ppuVar7;
            uStack_1f8 = puVar6[3];
          }
          else {
            local_200 = *ppuVar7;
            local_210 = (ulong **)*puVar6;
          }
          local_208 = puVar6[1];
          *puVar6 = ppuVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
          local_230 = &local_220;
          puVar12 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar12) {
            local_220 = *puVar12;
            lStack_218 = puVar6[3];
          }
          else {
            local_220 = *puVar12;
            local_230 = (ulong *)*puVar6;
          }
          local_228 = puVar6[1];
          *puVar6 = puVar12;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_1f0);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar13 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar13) {
            lVar8 = plVar5[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar8;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
          }
          __return_storage_ptr__->_M_string_length = plVar5[1];
          *plVar5 = (long)psVar13;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
        }
        else {
          uVar15 = ((long)labels_abi_cxx11_.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)labels_abi_cxx11_.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          iVar4 = line + iVar4 + 3;
          if ((labels_abi_cxx11_.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first != iVar4) {
            uVar2 = 1;
            ppVar14 = labels_abi_cxx11_.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              uVar17 = uVar2;
              ppVar14 = ppVar14 + 1;
              if (uVar15 + (uVar15 == 0) == uVar17) break;
              uVar2 = uVar17 + 1;
            } while (ppVar14->first != iVar4);
            if (uVar15 < uVar17 || uVar15 - uVar17 == 0) goto LAB_00126f34;
          }
          local_190[0] = local_180;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_190,local_170._M_dataplus._M_p,
                     local_170._M_dataplus._M_p + local_170._M_string_length);
          std::__cxx11::string::append((char *)local_190);
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)local_190,(ulong)local_110._M_dataplus._M_p);
          local_1d0 = &local_1c0;
          ppuVar7 = (ulong **)(puVar6 + 2);
          if ((ulong **)*puVar6 == ppuVar7) {
            local_1c0 = *ppuVar7;
            lStack_1b8 = puVar6[3];
          }
          else {
            local_1c0 = *ppuVar7;
            local_1d0 = (ulong **)*puVar6;
          }
          local_1c8 = puVar6[1];
          *puVar6 = ppuVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
          local_1b0 = &local_1a0;
          puVar12 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar12) {
            local_1a0 = *puVar12;
            lStack_198 = puVar6[3];
          }
          else {
            local_1a0 = *puVar12;
            local_1b0 = (ulong *)*puVar6;
          }
          local_1a8 = puVar6[1];
          *puVar6 = puVar12;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)local_130._M_dataplus._M_p);
          local_210 = &local_200;
          ppuVar7 = (ulong **)(puVar6 + 2);
          if ((ulong **)*puVar6 == ppuVar7) {
            local_200 = *ppuVar7;
            uStack_1f8 = puVar6[3];
          }
          else {
            local_200 = *ppuVar7;
            local_210 = (ulong **)*puVar6;
          }
          local_208 = puVar6[1];
          *puVar6 = ppuVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
          local_230 = &local_220;
          puVar12 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar12) {
            local_220 = *puVar12;
            lStack_218 = puVar6[3];
          }
          else {
            local_220 = *puVar12;
            local_230 = (ulong *)*puVar6;
          }
          local_228 = puVar6[1];
          *puVar6 = puVar12;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          getLabel_abi_cxx11_(&local_f0,(Disassembler *)(ulong)uVar16,(int)local_228);
          uVar15 = 0xf;
          if (local_230 != &local_220) {
            uVar15 = local_220;
          }
          if (uVar15 < local_f0._M_string_length + local_228) {
            uVar9 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              uVar9 = local_f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar9 < local_f0._M_string_length + local_228) goto LAB_0012732d;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_230);
          }
          else {
LAB_0012732d:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_230,(ulong)local_f0._M_dataplus._M_p);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar13 = puVar6 + 2;
          if ((size_type *)*puVar6 == psVar13) {
            uVar9 = puVar6[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
          }
          __return_storage_ptr__->_M_string_length = puVar6[1];
          *puVar6 = psVar13;
          puVar6[1] = 0;
          *(undefined1 *)psVar13 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0);
        }
        if (local_190[0] != local_180) {
          operator_delete(local_190[0]);
        }
        ppuVar7 = local_1f0;
        if (local_1f0 == &local_1e0) goto LAB_0012690a;
        goto LAB_00126905;
      }
      ppuVar19 = &local_1c0;
      local_1d0 = ppuVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,local_170._M_dataplus._M_p,
                 local_170._M_dataplus._M_p + local_170._M_string_length);
      std::__cxx11::string::append((char *)&local_1d0);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1d0,(ulong)local_130._M_dataplus._M_p);
      puVar12 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar12) {
        local_1a0 = *puVar12;
        lStack_198 = plVar5[3];
        local_1b0 = &local_1a0;
      }
      else {
        local_1a0 = *puVar12;
        local_1b0 = (ulong *)*plVar5;
      }
      local_1a8 = plVar5[1];
      *plVar5 = (long)puVar12;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
      ppuVar7 = (ulong **)(puVar6 + 2);
      if ((ulong **)*puVar6 == ppuVar7) {
        local_200 = *ppuVar7;
        uStack_1f8 = puVar6[3];
        local_210 = &local_200;
      }
      else {
        local_200 = *ppuVar7;
        local_210 = (ulong **)*puVar6;
      }
      local_208 = puVar6[1];
      *puVar6 = ppuVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_110._M_dataplus._M_p)
      ;
      puVar12 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar12) {
        local_220 = *puVar12;
        lStack_218 = puVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar12;
        local_230 = (ulong *)*puVar6;
      }
      local_228 = puVar6[1];
      *puVar6 = puVar12;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
      ppuVar7 = (ulong **)(puVar6 + 2);
      if ((ulong **)*puVar6 == ppuVar7) {
        local_1e0 = *ppuVar7;
        uStack_1d8 = puVar6[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *ppuVar7;
        local_1f0 = (ulong **)*puVar6;
      }
      local_1e8 = puVar6[1];
      *puVar6 = ppuVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_150[0]);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar13 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar13) {
        lVar8 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar8;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar13;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230);
      }
      if (local_210 != &local_200) {
        operator_delete(local_210);
      }
      ppuVar7 = local_1d0;
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0);
        ppuVar7 = local_1d0;
      }
    }
    if (ppuVar7 == ppuVar19) goto LAB_0012690a;
  }
LAB_00126905:
  operator_delete(ppuVar7);
LAB_0012690a:
  if (local_150[0] != local_140) {
    operator_delete(local_150[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::iType(string bin, int line){
    string op = AsmFuncts::getOpCode(bin.substr(0,6));
    string rs = AsmFuncts::getRegCode(bin.substr(6,5));
    string rt = AsmFuncts::getRegCode(bin.substr(11,5));
    string imm = std::to_string(Conversion::binToDec(bin.substr(16,16)));
    if((op == "sw") || (op == "lw")){
        return (op + " " + rt + ", " + imm + "(" + rs + ")");
    }
    if(op == "lui"){
        return (op + " " + rt + ", " + imm);
    }
    if((op == "bne")||(op == "beq")){
        string label = "LABEL_"+to_string(labelCount);
        int l = line + stoi(imm) + 1;
        if(!labelExists(l)){
          addLabel(l,label);
          return (op + " " + rs + ", " + rt + ", "+label);
        }
        else
          return (op + " " + rs + ", " + rt + ", "+getLabel(l));
    }
    return (op + " " + rt + ", " + rs + ", " + imm);
}